

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_get_splt(spng_ctx *ctx,spng_splt *splt,uint32_t *n_splt)

{
  int ret;
  uint32_t *n_splt_local;
  spng_splt *splt_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      if (((uint)ctx->stored >> 0xc & 1) == 0) {
        ctx_local._4_4_ = 0x49;
      }
      else if (n_splt == (uint32_t *)0x0) {
        ctx_local._4_4_ = 1;
      }
      else if (splt == (spng_splt *)0x0) {
        *n_splt = ctx->n_splt;
        ctx_local._4_4_ = 0;
      }
      else if (*n_splt < ctx->n_splt) {
        ctx_local._4_4_ = 1;
      }
      else {
        memcpy(splt,ctx->splt_list,(ulong)ctx->n_splt * 0x60);
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_get_splt(spng_ctx *ctx, struct spng_splt *splt, uint32_t *n_splt)
{
    if(ctx == NULL) return 1;
    int ret = read_chunks(ctx, 0);
    if(ret) return ret;
    if(!ctx->stored.splt) return SPNG_ECHUNKAVAIL;
    if(n_splt == NULL) return 1;

    if(splt == NULL)
    {
        *n_splt = ctx->n_splt;
        return 0;
    }

    if(*n_splt < ctx->n_splt) return 1;

    memcpy(splt, ctx->splt_list, ctx->n_splt * sizeof(struct spng_splt));

    return 0;
}